

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void detachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3 *db;
  Db *pDVar1;
  Btree *p;
  int iVar2;
  uchar *puVar3;
  uchar *zRight;
  char *zFormat;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char zErr [128];
  
  puVar3 = sqlite3_value_text(*argv);
  zRight = "";
  if (puVar3 != (uchar *)0x0) {
    zRight = puVar3;
  }
  db = context->pOut->db;
  uVar5 = 0;
  uVar4 = (ulong)(uint)db->nDb;
  if (db->nDb < 1) {
    uVar4 = uVar5;
  }
  uVar6 = 0;
  do {
    if (uVar4 == uVar6) {
      zFormat = "no such database: %s";
LAB_001a9d3a:
      sqlite3_snprintf(0x80,zErr,zFormat,zRight);
      sqlite3_result_error(context,zErr,-1);
      return;
    }
    pDVar1 = db->aDb;
    p = *(Btree **)((long)&pDVar1->pBt + uVar5);
    if (p != (Btree *)0x0) {
      iVar2 = sqlite3StrICmp(*(char **)((long)&pDVar1->zDbSName + uVar5),(char *)zRight);
      if (iVar2 == 0) {
        if (uVar6 < 2) {
          zFormat = "cannot detach database %s";
        }
        else {
          zFormat = "database %s is locked";
          if ((p->inTrans == '\0') && (p->nBackup == 0)) {
            sqlite3BtreeClose(p);
            *(undefined8 *)((long)&pDVar1->pBt + uVar5) = 0;
            *(undefined8 *)((long)&pDVar1->pSchema + uVar5) = 0;
            sqlite3CollapseDatabaseArray(db);
            return;
          }
        }
        goto LAB_001a9d3a;
      }
    }
    uVar6 = uVar6 + 1;
    uVar5 = uVar5 + 0x20;
  } while( true );
}

Assistant:

static void detachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  const char *zName = (const char *)sqlite3_value_text(argv[0]);
  sqlite3 *db = sqlite3_context_db_handle(context);
  int i;
  Db *pDb = 0;
  char zErr[128];

  UNUSED_PARAMETER(NotUsed);

  if( zName==0 ) zName = "";
  for(i=0; i<db->nDb; i++){
    pDb = &db->aDb[i];
    if( pDb->pBt==0 ) continue;
    if( sqlite3StrICmp(pDb->zDbSName, zName)==0 ) break;
  }

  if( i>=db->nDb ){
    sqlite3_snprintf(sizeof(zErr),zErr, "no such database: %s", zName);
    goto detach_error;
  }
  if( i<2 ){
    sqlite3_snprintf(sizeof(zErr),zErr, "cannot detach database %s", zName);
    goto detach_error;
  }
  if( sqlite3BtreeIsInReadTrans(pDb->pBt) || sqlite3BtreeIsInBackup(pDb->pBt) ){
    sqlite3_snprintf(sizeof(zErr),zErr, "database %s is locked", zName);
    goto detach_error;
  }

  sqlite3BtreeClose(pDb->pBt);
  pDb->pBt = 0;
  pDb->pSchema = 0;
  sqlite3CollapseDatabaseArray(db);
  return;

detach_error:
  sqlite3_result_error(context, zErr, -1);
}